

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

Stream * __thiscall kratos::Stream::operator<<(Stream *this,shared_ptr<kratos::Var> *var)

{
  undefined1 *puVar1;
  ostream *poVar2;
  Var *in_RDX;
  Var *extraout_RDX;
  Var *extraout_RDX_00;
  element_type *peVar3;
  undefined1 local_50 [8];
  string var_str;
  
  peVar3 = (var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar3->super_IRNode).comment._M_string_length != 0) {
    puVar1 = &(this->super_stringstream).field_0x10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"// ",3);
    strip_newline((string *)local_50,
                  &(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   super_IRNode).comment);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(char *)local_50,(long)var_str._M_dataplus._M_p);
    puVar1 = &(this->super_stringstream).field_0x90;
    *(long *)puVar1 = *(long *)puVar1 + 1;
    var_str.field_2._M_local_buf[0xf] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,var_str.field_2._M_local_buf + 0xf,1);
    in_RDX = extraout_RDX;
    if (local_50 != (undefined1  [8])&var_str._M_string_length) {
      operator_delete((void *)local_50,var_str._M_string_length + 1);
      in_RDX = extraout_RDX_00;
    }
    peVar3 = (var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  if (*(char *)(*(long *)&(this->super_stringstream).field_0x80 + 0xbc) == '\x01') {
    (peVar3->super_IRNode).verilog_ln = *(uint32_t *)&(this->super_stringstream).field_0x90;
  }
  get_var_decl_abi_cxx11_((string *)local_50,(Stream *)peVar3,in_RDX);
  peVar3 = (var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&(this->super_stringstream).field_0x10,
                      (peVar3->before_var_str_)._M_dataplus._M_p,
                      (peVar3->before_var_str_)._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_50,(long)var_str._M_dataplus._M_p);
  peVar3 = (var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(peVar3->after_var_str_)._M_dataplus._M_p,
                      (peVar3->after_var_str_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,";",1);
  puVar1 = &(this->super_stringstream).field_0x90;
  *(long *)puVar1 = *(long *)puVar1 + 1;
  var_str.field_2._M_local_buf[0xf] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,var_str.field_2._M_local_buf + 0xf,1);
  if (local_50 != (undefined1  [8])&var_str._M_string_length) {
    operator_delete((void *)local_50,var_str._M_string_length + 1);
  }
  return this;
}

Assistant:

Stream& Stream::operator<<(const std::shared_ptr<Var>& var) {
    if (!var->comment.empty()) (*this) << "// " << strip_newline(var->comment) << endl();

    if (generator_->debug) {
        var->verilog_ln = line_no_;
    }

    auto var_str = get_var_decl(var.get());

    (*this) << var->before_var_str() << var_str << var->after_var_str() << ";" << endl();
    return *this;
}